

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ElementSelectExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ElementSelectExpressionSyntax,slang::syntax::ElementSelectExpressionSyntax_const&>
          (BumpAllocator *this,ElementSelectExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  ExpressionSyntax *pEVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  ElementSelectExpressionSyntax *pEVar5;
  
  pEVar5 = (ElementSelectExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ElementSelectExpressionSyntax *)this->endPtr < pEVar5 + 1) {
    pEVar5 = (ElementSelectExpressionSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pEVar5 + 1);
  }
  (pEVar5->select).ptr = (args->select).ptr;
  SVar3 = (args->super_ExpressionSyntax).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(args->super_ExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ExpressionSyntax).super_SyntaxNode.parent;
  pEVar2 = (args->left).ptr;
  (pEVar5->super_ExpressionSyntax).super_SyntaxNode.previewNode =
       (args->super_ExpressionSyntax).super_SyntaxNode.previewNode;
  (pEVar5->left).ptr = pEVar2;
  (pEVar5->super_ExpressionSyntax).super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(pEVar5->super_ExpressionSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pEVar5->super_ExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  return pEVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }